

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KVStringPair.cpp
# Opt level: O1

void __thiscall xercesc_4_0::KVStringPair::serialize(KVStringPair *this,XSerializeEngine *serEng)

{
  XMLSize_t dataLen;
  XMLSize_t local_30;
  
  if (serEng->fStoreLoad != 0) {
    local_30 = 0;
    XSerializeEngine::readString(serEng,&this->fKey,&this->fKeyAllocSize,&local_30,true);
    XSerializeEngine::readString(serEng,&this->fValue,&this->fValueAllocSize,&local_30,true);
    return;
  }
  XSerializeEngine::writeString(serEng,this->fKey,this->fKeyAllocSize,true);
  XSerializeEngine::writeString(serEng,this->fValue,this->fValueAllocSize,true);
  return;
}

Assistant:

void KVStringPair::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {

        serEng.writeString(fKey,   fKeyAllocSize,   XSerializeEngine::toWriteBufferLen);
        serEng.writeString(fValue, fValueAllocSize, XSerializeEngine::toWriteBufferLen);
    }
    else
    {
        XMLSize_t dataLen = 0;
        serEng.readString(fKey,   fKeyAllocSize,   dataLen, XSerializeEngine::toReadBufferLen);
        serEng.readString(fValue, fValueAllocSize, dataLen, XSerializeEngine::toReadBufferLen);
    }

}